

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void sum_write(archive_string *str,reg_info *reg)

{
  reg_info *reg_local;
  archive_string *str_local;
  
  if ((reg->compute_sum & 1U) != 0) {
    archive_string_sprintf(str," cksum=%ju",(ulong)reg->crc);
  }
  if ((reg->compute_sum & 0x100U) != 0) {
    archive_strcat(str," md5digest=");
    strappend_bin(str,(reg->digest).md5,L'\x10');
  }
  if ((reg->compute_sum & 0x2000U) != 0) {
    archive_strcat(str," rmd160digest=");
    strappend_bin(str,(reg->digest).rmd160,L'\x14');
  }
  if ((reg->compute_sum & 0x4000U) != 0) {
    archive_strcat(str," sha1digest=");
    strappend_bin(str,(reg->digest).sha1,L'\x14');
  }
  if ((reg->compute_sum & 0x800000U) != 0) {
    archive_strcat(str," sha256digest=");
    strappend_bin(str,(reg->digest).sha256,L' ');
  }
  if ((reg->compute_sum & 0x1000000U) != 0) {
    archive_strcat(str," sha384digest=");
    strappend_bin(str,(reg->digest).sha384,L'0');
  }
  if ((reg->compute_sum & 0x2000000U) != 0) {
    archive_strcat(str," sha512digest=");
    strappend_bin(str,(reg->digest).sha512,L'@');
  }
  return;
}

Assistant:

static void
sum_write(struct archive_string *str, struct reg_info *reg)
{

	if (reg->compute_sum & F_CKSUM) {
		archive_string_sprintf(str, " cksum=%ju",
		    (uintmax_t)reg->crc);
	}

#define append_digest(_s, _r, _t) \
	strappend_bin(_s, _r->digest._t, sizeof(_r->digest._t))

#ifdef ARCHIVE_HAS_MD5
	if (reg->compute_sum & F_MD5) {
		archive_strcat(str, " md5digest=");
		append_digest(str, reg, md5);
	}
#endif
#ifdef ARCHIVE_HAS_RMD160
	if (reg->compute_sum & F_RMD160) {
		archive_strcat(str, " rmd160digest=");
		append_digest(str, reg, rmd160);
	}
#endif
#ifdef ARCHIVE_HAS_SHA1
	if (reg->compute_sum & F_SHA1) {
		archive_strcat(str, " sha1digest=");
		append_digest(str, reg, sha1);
	}
#endif
#ifdef ARCHIVE_HAS_SHA256
	if (reg->compute_sum & F_SHA256) {
		archive_strcat(str, " sha256digest=");
		append_digest(str, reg, sha256);
	}
#endif
#ifdef ARCHIVE_HAS_SHA384
	if (reg->compute_sum & F_SHA384) {
		archive_strcat(str, " sha384digest=");
		append_digest(str, reg, sha384);
	}
#endif
#ifdef ARCHIVE_HAS_SHA512
	if (reg->compute_sum & F_SHA512) {
		archive_strcat(str, " sha512digest=");
		append_digest(str, reg, sha512);
	}
#endif
#undef append_digest
}